

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O2

char * do_pathnormalize(char *from,char *to)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  sys_unbashfilename(from,to);
  pcVar4 = to;
  pcVar5 = to;
  while( true ) {
    cVar2 = *pcVar5;
    *pcVar4 = cVar2;
    if (cVar2 == '\0') break;
    pcVar4 = pcVar4 + 1;
    pcVar3 = pcVar5 + 1;
    pcVar1 = pcVar5;
    while (pcVar5 = pcVar3, cVar2 == '/') {
      pcVar5 = pcVar1 + 1;
      pcVar1 = pcVar1 + 1;
      pcVar3 = pcVar1;
      cVar2 = *pcVar5;
    }
  }
  return to;
}

Assistant:

static char*do_pathnormalize(const char *from, char *to) {
    const char *rp;
    char *wp, c;
    sys_unbashfilename(from, to);
    rp=wp=to;
    while((*wp++=c=*rp++)) {
        if('/' == c) {
            while('/' == *rp++);
            rp--;
        }
    }
    return to;
}